

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calcdb.cc
# Opt level: O0

int __thiscall DbaseCtrlBlk::init(DbaseCtrlBlk *this,EVP_PKEY_CTX *ctx)

{
  undefined1 auVar1 [16];
  int iVar2;
  char *__file;
  runtime_error *this_00;
  ulong uVar3;
  int *piVar4;
  unsigned_long uVar5;
  int in_EDX;
  int buf_sz_local;
  string *infilename_local;
  DbaseCtrlBlk *this_local;
  
  __file = (char *)std::__cxx11::string::c_str();
  iVar2 = open(__file,0);
  this->fd = iVar2;
  if (this->fd < 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"ERROR: InvalidFile -- Dbase_Ctrl_Blk()");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this->buf_size = in_EDX;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)in_EDX;
  uVar3 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  piVar4 = (int *)operator_new__(uVar3);
  this->buf = piVar4;
  this->cur_buf_pos = 0;
  this->cur_blk_size = 0;
  this->readall = '\0';
  uVar5 = lseek(this->fd,0,2);
  this->endpos = uVar5;
  return (int)this;
}

Assistant:

void DbaseCtrlBlk::init(const string &infilename, int buf_sz) {
    fd = open(infilename.c_str(), O_RDONLY | O_BINARY);
    if (fd < 0) {
        throw runtime_error("ERROR: InvalidFile -- Dbase_Ctrl_Blk()");
    }

    buf_size = buf_sz;
    buf = new int[buf_sz];
    cur_buf_pos = 0;
    cur_blk_size = 0;
    readall = 0;
    endpos = lseek(fd, 0, SEEK_END);
}